

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL CreateDirectoryW(LPCWSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  FILE *pFVar1;
  int cbMultiByte;
  DWORD DVar2;
  int iVar3;
  uint *puVar4;
  LPCSTR local_30;
  char *mb_dir;
  DWORD local_20;
  int mb_size;
  DWORD dwLastError;
  BOOL bRet;
  LPSECURITY_ATTRIBUTES lpSecurityAttributes_local;
  LPCWSTR lpPathName_local;
  
  mb_size = 0;
  local_20 = 0;
  local_30 = (LPCSTR)0x0;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    cbMultiByte = WideCharToMultiByte(0,0,lpPathName,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
    if (cbMultiByte == 0) {
      fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
              ,0x4d);
      pFVar1 = _stderr;
      DVar2 = GetLastError();
      fprintf(pFVar1,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
      local_20 = 0x54f;
    }
    else {
      local_30 = (LPCSTR)PAL_malloc((long)cbMultiByte);
      if ((local_30 == (LPCSTR)0x0) ||
         (iVar3 = WideCharToMultiByte(0,0,lpPathName,-1,local_30,cbMultiByte,(LPCSTR)0x0,(LPBOOL)0x0
                                     ), iVar3 != cbMultiByte)) {
        fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
                ,0x57);
        pFVar1 = _stderr;
        DVar2 = GetLastError();
        puVar4 = (uint *)__errno_location();
        fprintf(pFVar1,"WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
                (ulong)DVar2,(ulong)*puVar4);
        local_20 = 0x54f;
      }
      else {
        mb_size = CreateDirectoryA(local_30,(LPSECURITY_ATTRIBUTES)0x0);
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryW",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x44);
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    local_20 = 0x57;
  }
  if (local_20 != 0) {
    SetLastError(local_20);
  }
  if (local_30 != (LPCSTR)0x0) {
    PAL_free(local_30);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return mb_size;
  }
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryW(
         IN LPCWSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    int   mb_size;
    char  *mb_dir = NULL;

    PERF_ENTRY(CreateDirectoryW);
    ENTRY("CreateDirectoryW(lpPathName=%p (%S), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:W16_NULLSTRING,
          lpPathName?lpPathName:W16_NULLSTRING, lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    /* translate the wide char lpPathName string to multibyte string */
    if(0 == (mb_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, NULL, 0,
                                            NULL, NULL )))
    {
        ASSERT("WideCharToMultiByte failure! error is %d\n", GetLastError());
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    if (((mb_dir = (char *)PAL_malloc(mb_size)) == NULL) ||
        (WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, mb_dir, mb_size, NULL,
                              NULL) != mb_size))
    {
        ASSERT("WideCharToMultiByte or PAL_malloc failure! LastError:%d errno:%d\n",
              GetLastError(), errno);
        dwLastError = ERROR_INTERNAL_ERROR;
        goto done;
    }

    bRet = CreateDirectoryA(mb_dir,NULL);
done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    if (mb_dir != NULL)
    {
        PAL_free(mb_dir);
    }
    LOGEXIT("CreateDirectoryW returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryW);
    return bRet;
}